

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::iterate(SampleMaskCase *this)

{
  TestLog *log;
  bool bVar1;
  undefined1 local_150 [6];
  bool iterationOk;
  byte local_12f;
  byte local_12e;
  byte local_12d;
  int local_12c;
  string local_128;
  byte local_102;
  byte local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  byte local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  SampleMaskCase_conflict *this_local;
  
  section.m_log = (TestLog *)this;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Iteration",&local_41);
  local_7a = 0;
  local_101 = 0;
  local_102 = 0;
  local_12d = 0;
  local_12e = 0;
  local_12f = 0;
  bVar1 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) != -1;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_100);
    local_101 = 1;
    std::operator+(&local_e0,&local_100,"Verifying sample ");
    local_102 = 1;
    local_12c = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
                + 1;
    de::toString<int>(&local_128,&local_12c);
    local_12d = 1;
    std::operator+(&local_c0,&local_e0,&local_128);
    local_12e = 1;
    std::operator+(&local_a0,&local_c0,"/");
    local_12f = 1;
    de::toString<int>((string *)local_150,(int *)&this->m_verifierType);
    std::operator+(&local_78,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Verifying with zero mask",&local_79);
  }
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_150);
  }
  if ((local_12f & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_12e & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_12d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((local_102 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  updateTexture(this,*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx
                             + 4));
  bVar1 = verifyTexture(this,*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                             m_testCtx + 4));
  if (!bVar1) {
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name = 0;
  }
  *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
       *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) + 1;
  if (*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) <
      (int)this->m_verifierType) {
    this_local._4_4_ = CONTINUE;
  }
  else {
    if (*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name == 0) {
      if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Sample test failed");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Unused mask bits have effect");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    this_local._4_4_ = STOP;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return this_local._4_4_;
}

Assistant:

SampleMaskCase::IterateResult SampleMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, -1, m_verifierType);
	}

	// fixed values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "fixed", "Fixed values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
		{
			gl.glSampleMaski(ndx, 0);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, 0, m_verifierType);
		}
	}

	// random masks
	{
		const int					numRandomTest	= 20;
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0x4312);

		for (int testNdx = 0; testNdx < numRandomTest; ++testNdx)
		{
			const glw::GLint	maskIndex		= (glw::GLint)(rnd.getUint32() % m_maxSampleMaskWords);
			glw::GLint			mask			= (glw::GLint)(rnd.getUint32());

			gl.glSampleMaski(maskIndex, mask);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, maskIndex, mask, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}